

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

string * __thiscall
soul::AST::ProcessorInstance::getReadableName_abi_cxx11_
          (string *__return_storage_ptr__,ProcessorInstance *this)

{
  Expression *pEVar1;
  long *plVar2;
  UnqualifiedName *this_00;
  long lVar3;
  pool_ptr<soul::AST::ProcessorBase> target;
  long local_20;
  
  if ((((this->implicitInstanceSource).object != (SharedEndpoint *)0x0) &&
      (pEVar1 = (this->targetProcessor).object, pEVar1 != (Expression *)0x0)) &&
     ((*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_20), local_20 != 0)) {
    lVar3 = *(long *)(local_20 + 0x128);
    if ((*(long *)(local_20 + 0x128) == 0) && (lVar3 = local_20, local_20 == 0)) goto LAB_00219d40;
    plVar2 = *(long **)(lVar3 + 0x40);
    if (plVar2 == (long *)0x0) {
      throwInternalCompilerError("isValid()","toString",0x23);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar2,plVar2[1] + *plVar2);
    if (local_20 != 0) {
      return __return_storage_ptr__;
    }
  }
  this_00 = (this->instanceName).object;
  if (this_00 != (UnqualifiedName *)0x0) {
    UnqualifiedName::toString_abi_cxx11_(__return_storage_ptr__,this_00);
    return __return_storage_ptr__;
  }
LAB_00219d40:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

std::string getReadableName() const
        {
            if (isImplicitlyCreated() && targetProcessor != nullptr)
            {
                if (auto target = targetProcessor->getAsProcessor())
                {
                    if (auto original = target->originalBeforeSpecialisation)
                        return original->name.toString();

                    return target->name.toString();
                }
            }

            return instanceName->toString();
        }